

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONWorker.cpp
# Opt level: O3

void JSONWorker::DoNode(internalJSONNode *parent,json_string *value_t)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  pointer pcVar3;
  size_t pos;
  size_t sVar4;
  json_string name;
  json_string local_70;
  json_string local_50;
  
  sVar2 = value_t->_M_string_length;
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"DoNode is empty","");
  JSONDebug::_JSON_ASSERT(sVar2 != 0,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (*(value_t->_M_dataplus)._M_p == '{') {
    if (value_t->_M_string_length < 3) {
      return;
    }
    pos = FindNextRelevant<(char)58>(value_t,1);
    if (pos != 0xffffffffffffffff) {
      pcVar3 = (value_t->_M_dataplus)._M_p;
      local_70._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&local_70,pcVar3 + 1,pcVar3 + (pos - 1));
      sVar4 = FindNextRelevant<(char)44>(value_t,pos);
      if (sVar4 != 0xffffffffffffffff) {
        paVar1 = &local_50.field_2;
        do {
          pcVar3 = (value_t->_M_dataplus)._M_p;
          local_50._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((string *)&local_50,pcVar3 + pos + 1,pcVar3 + sVar4);
          NewNode(parent,&local_70,&local_50,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != paVar1) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          pos = FindNextRelevant<(char)58>(value_t,sVar4 + 1);
          if (pos == 0xffffffffffffffff) {
            local_50._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Missing :","");
            JSONDebug::_JSON_FAIL(&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != paVar1) {
              operator_delete(local_50._M_dataplus._M_p);
            }
            internalJSONNode::Nullify(parent);
            goto LAB_00114d05;
          }
          std::__cxx11::string::replace
                    ((ulong)&local_70,0,(char *)local_70._M_string_length,
                     (ulong)((value_t->_M_dataplus)._M_p + sVar4 + 1));
          sVar4 = FindNextRelevant<(char)44>(value_t,pos);
        } while (sVar4 != 0xffffffffffffffff);
      }
      pcVar3 = (value_t->_M_dataplus)._M_p;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&local_50,pcVar3 + pos + 1,pcVar3 + (value_t->_M_string_length - 1));
      NewNode(parent,&local_70,&local_50,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
LAB_00114d05:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p == &local_70.field_2) {
        return;
      }
      operator_delete(local_70._M_dataplus._M_p);
      return;
    }
    local_70._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Missing :","");
  }
  else {
    local_70._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"DoNode is not an node","");
  }
  JSONDebug::_JSON_FAIL(&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  internalJSONNode::Nullify(parent);
  return;
}

Assistant:

void JSONWorker::DoNode(const internalJSONNode * parent, const json_string & value_t) json_nothrow {	
	//This take a node and creates its members and such
	JSON_ASSERT(!value_t.empty(), JSON_TEXT("DoNode is empty"));
	JSON_ASSERT_SAFE(value_t[0] == JSON_TEXT('{'), JSON_TEXT("DoNode is not an node"), parent -> Nullify(); return;);
	if (json_unlikely(value_t.length() <= 2)) return;  // just a {} (blank node)
	
	size_t name_ending = FIND_NEXT_RELEVANT(JSON_TEXT(':'), value_t, 1);  //find where the name ends
	JSON_ASSERT_SAFE(name_ending != json_string::npos, JSON_TEXT("Missing :"), parent -> Nullify(); return;);
	json_string name(value_t.begin() + 1, value_t.begin() + name_ending - 1);	  //pull the name out
	for (size_t value_ending = FIND_NEXT_RELEVANT(JSON_TEXT(','), value_t, name_ending),  //find the end of the value
		 name_starting = 1;  //ignore the {
		 value_ending != json_string::npos;
		 value_ending = FIND_NEXT_RELEVANT(JSON_TEXT(','), value_t, name_ending)){
		
		NewNode(parent, name, json_string(value_t.begin() + name_ending + 1, value_t.begin() + value_ending), false);
		name_starting = value_ending + 1;
		name_ending = FIND_NEXT_RELEVANT(JSON_TEXT(':'), value_t, name_starting);
		JSON_ASSERT_SAFE(name_ending != json_string::npos, JSON_TEXT("Missing :"), parent -> Nullify(); return;);
		name.assign(value_t.begin() + name_starting, value_t.begin() + name_ending - 1);
	}
	//since the last one will not find the comma, we have to add it here
	NewNode(parent, name, json_string(value_t.begin() + name_ending + 1, value_t.end() - 1), false);
}